

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O2

void __thiscall mognetwork::TcpASIOServer::~TcpASIOServer(TcpASIOServer *this)

{
  this->_vptr_TcpASIOServer = (_func_int **)&PTR__TcpASIOServer_00114af0;
  if (this->m_serverListener != (TcpASIOListener *)0x0) {
    (*(this->m_serverListener->super_IRunnable)._vptr_IRunnable[1])();
  }
  if (this->m_serverWriter != (TcpASIOWriter *)0x0) {
    (*(this->m_serverWriter->super_IRunnable)._vptr_IRunnable[1])();
  }
  if (this->m_protocolFactory != (IProtocolFactory *)0x0) {
    (*this->m_protocolFactory->_vptr_IProtocolFactory[1])();
  }
  std::__cxx11::_List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::
  _M_clear(&(this->m_socketList).
            super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>);
  Mutex::~Mutex(&this->m_mutex);
  TcpServerSocket::~TcpServerSocket(&this->m_serverSocket);
  return;
}

Assistant:

TcpASIOServer::~TcpASIOServer()
  {
    delete m_serverListener;
    delete m_serverWriter;
    delete m_protocolFactory;
  }